

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomNameVisitor.cpp
# Opt level: O1

void __thiscall OpenMD::AtomNameVisitor::visitAtom(AtomNameVisitor *this,Atom *atom)

{
  pointer psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  AtomData *pAVar2;
  ostream *poVar3;
  AtomType *this_01;
  pointer psVar4;
  element_type *at;
  AtomData *pAVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  string bn;
  vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> ayb;
  shared_ptr<OpenMD::GenericData> data;
  undefined1 local_88 [32];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  long local_50;
  undefined1 local_48 [16];
  AtomNameVisitor *local_38;
  
  local_88._0_8_ = local_88 + 0x10;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"ATOMDATA","");
  StuntDouble::getPropertyByName((StuntDouble *)local_48,(string *)atom);
  if ((AtomData *)local_88._0_8_ != (AtomData *)(local_88 + 0x10)) {
    operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
  }
  if ((_func_int **)local_48._0_8_ == (_func_int **)0x0) {
    local_88._0_8_ = (AtomData *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),(AtomData **)local_88,
               (allocator<OpenMD::AtomData> *)&local_60);
    local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
    pAVar5 = (AtomData *)local_88._0_8_;
    local_88._0_8_ = (AtomData *)0x0;
    local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    pAVar2 = (AtomData *)__dynamic_cast(local_48._0_8_,&GenericData::typeinfo,&AtomData::typeinfo,0)
    ;
    pAVar5 = (AtomData *)0x0;
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if ((pAVar2 != (AtomData *)0x0) &&
       (pAVar5 = pAVar2, p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_,
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_48._8_8_ + 8) = *(_Atomic_word *)(local_48._8_8_ + 8) + 1;
      }
    }
    local_68 = p_Var6;
    if (pAVar5 != (AtomData *)0x0) goto LAB_0021b29c;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"can not get Atom Data from ",0x1b);
    (*(atom->super_StuntDouble)._vptr_StuntDouble[7])(local_88,atom);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_88._0_8_,local_88._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    if ((AtomData *)local_88._0_8_ != (AtomData *)(local_88 + 0x10)) {
      operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
    }
    local_88._0_8_ = (AtomData *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<OpenMD::AtomData,std::allocator<OpenMD::AtomData>>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8),(AtomData **)local_88,
               (allocator<OpenMD::AtomData> *)&local_60);
    local_68 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_;
    pAVar5 = (AtomData *)local_88._0_8_;
    local_88._0_8_ = (AtomData *)0x0;
    local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
LAB_0021b29c:
  psVar1 = (pAVar5->data).
           super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (psVar1 == (pAVar5->data).
                super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    at = (element_type *)0x0;
    p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    at = (psVar1->super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    p_Var6 = (psVar1->super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
    if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
      }
    }
  }
  while (this_00 = p_Var6, at != (element_type *)0x0) {
    psVar4 = psVar1 + 1;
    this_01 = ForceField::getAtomType(local_38->ff_,&at->atomTypeName);
    if (this_01 != (AtomType *)0x0) {
      AtomType::allYourBase
                ((vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_> *)&local_60,
                 this_01);
      AtomType::getName_abi_cxx11_((string *)local_88,*(AtomType **)(local_60._8_8_ + -8));
      std::__cxx11::string::_M_assign((string *)at);
      if ((AtomData *)local_88._0_8_ != (AtomData *)(local_88 + 0x10)) {
        operator_delete((void *)local_88._0_8_,local_88._16_8_ + 1);
      }
      if ((void *)local_60._M_allocated_capacity != (void *)0x0) {
        operator_delete((void *)local_60._M_allocated_capacity,local_50 - local_60._0_8_);
      }
    }
    if (psVar4 == (pAVar5->data).
                  super__Vector_base<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      at = (element_type *)0x0;
      p_Var6 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    }
    else {
      at = (psVar4->super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      p_Var6 = psVar1[1].super___shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
    }
    psVar1 = psVar4;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    }
  }
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  p_Var6 = local_68;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._8_8_);
  }
  if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var6);
  }
  return;
}

Assistant:

void AtomNameVisitor::visitAtom(Atom* atom) {
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<GenericData> data = atom->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);
      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << atom->getType()
                  << std::endl;
        atomData = std::make_shared<AtomData>();
      }
    } else {
      atomData = std::make_shared<AtomData>();
    }

    std::vector<std::shared_ptr<AtomInfo>>::iterator i;
    for (std::shared_ptr<AtomInfo> atomInfo = atomData->beginAtomInfo(i);
         atomInfo != nullptr; atomInfo      = atomData->nextAtomInfo(i)) {
      // query the force field for the AtomType associated with this
      // atomTypeName:
      AtomType* at = ff_->getAtomType(atomInfo->atomTypeName);
      // Sometimes the atomInfo is set to a fictitious type, so we'll
      // only do base replacement if this AtomType is known in the forceField:
      if (at != NULL) {
        // get the chain of base types for this atom type:
        std::vector<AtomType*> ayb = at->allYourBase();
        // use the last type in the chain of base types for the name:
        std::string bn = ayb[ayb.size() - 1]->getName();

        atomInfo->atomTypeName = bn;
      }
    }
  }